

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

VkResult shim_vkEnumerateDeviceExtensionProperties
                   (VkPhysicalDevice physicalDevice,char *pLayerName,uint32_t *pPropertyCount,
                   VkExtensionProperties *pProperties)

{
  ulong uVar1;
  int iVar2;
  VkResult VVar3;
  size_type sVar4;
  reference __s1;
  reference data_vec;
  PhysicalDeviceDetails *pPVar5;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_58;
  ulong local_38;
  size_t i;
  VkExtensionProperties *pProperties_local;
  uint32_t *pPropertyCount_local;
  char *pLayerName_local;
  VkPhysicalDevice physicalDevice_local;
  
  i = (size_t)pProperties;
  pProperties_local = (VkExtensionProperties *)pPropertyCount;
  pPropertyCount_local = (uint32_t *)pLayerName;
  pLayerName_local = (char *)physicalDevice;
  if (pLayerName == (char *)0x0) {
    pPVar5 = get_physical_device_details(physicalDevice);
    physicalDevice_local._4_4_ =
         fill_out_count_pointer_pair<VkExtensionProperties>
                   (&pPVar5->extensions,(uint32_t *)pProperties_local,(VkExtensionProperties *)i);
  }
  else {
    for (local_38 = 0; uVar1 = local_38,
        sVar4 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::size
                          (&mock.instance_layers), uVar1 < sVar4; local_38 = local_38 + 1) {
      __s1 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::operator[]
                       (&mock.instance_layers,local_38);
      iVar2 = strcmp(__s1->layerName,(char *)pPropertyCount_local);
      if (iVar2 == 0) {
        data_vec = std::
                   vector<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>,_std::allocator<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>_>
                   ::operator[](&mock.per_layer_device_extension_properties,local_38);
        VVar3 = fill_out_count_pointer_pair<VkExtensionProperties>
                          (data_vec,(uint32_t *)pProperties_local,(VkExtensionProperties *)i);
        return VVar3;
      }
    }
    local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector(&local_58);
    physicalDevice_local._4_4_ =
         fill_out_count_pointer_pair<VkExtensionProperties>
                   (&local_58,(uint32_t *)pProperties_local,(VkExtensionProperties *)i);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector(&local_58);
  }
  return physicalDevice_local._4_4_;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkEnumerateDeviceExtensionProperties(
    VkPhysicalDevice physicalDevice, const char* pLayerName, uint32_t* pPropertyCount, VkExtensionProperties* pProperties) {
    if (pLayerName) {
        for (size_t i = 0; i < mock.instance_layers.size(); i++) {
            if (strcmp(mock.instance_layers[i].layerName, pLayerName) == 0) {
                return fill_out_count_pointer_pair(mock.per_layer_device_extension_properties[i], pPropertyCount, pProperties);
            }
        }
        // Layer not found, fill out with empty list
        return fill_out_count_pointer_pair({}, pPropertyCount, pProperties);
    }
    return fill_out_count_pointer_pair(get_physical_device_details(physicalDevice).extensions, pPropertyCount, pProperties);
}